

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void InterpolateRow_C(uint8_t *dst_ptr,uint8_t *src_ptr,ptrdiff_t src_stride,int width,
                     int source_y_fraction)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int y1_fraction;
  int iVar4;
  
  if (source_y_fraction != 0) {
    if (source_y_fraction == 0x80) {
      uVar1 = 0;
      uVar2 = (ulong)(uint)width;
      if (width < 1) {
        uVar2 = uVar1;
      }
      for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
        dst_ptr[uVar1] =
             (uint8_t)((uint)src_ptr[uVar1] + (uint)src_ptr[uVar1 + src_stride] + 1 >> 1);
      }
    }
    else {
      iVar4 = 0x100 - source_y_fraction;
      for (lVar3 = 0; (int)lVar3 < width + -1; lVar3 = lVar3 + 2) {
        dst_ptr[lVar3] =
             (uint8_t)((uint)src_ptr[lVar3 + src_stride] * source_y_fraction +
                       (uint)src_ptr[lVar3] * iVar4 + 0x80 >> 8);
        dst_ptr[lVar3 + 1] =
             (uint8_t)((uint)src_ptr[lVar3 + src_stride + 1] * source_y_fraction +
                       (uint)src_ptr[lVar3 + 1] * iVar4 + 0x80 >> 8);
      }
      if ((width & 1U) != 0) {
        dst_ptr[lVar3] =
             (uint8_t)((uint)src_ptr[lVar3 + src_stride] * source_y_fraction +
                       iVar4 * (uint)src_ptr[lVar3] + 0x80 >> 8);
      }
    }
    return;
  }
  memcpy(dst_ptr,src_ptr,(long)width);
  return;
}

Assistant:

void InterpolateRow_C(uint8_t* dst_ptr,
                      const uint8_t* src_ptr,
                      ptrdiff_t src_stride,
                      int width,
                      int source_y_fraction) {
  int y1_fraction = source_y_fraction;
  int y0_fraction = 256 - y1_fraction;
  const uint8_t* src_ptr1 = src_ptr + src_stride;
  int x;
  if (y1_fraction == 0) {
    memcpy(dst_ptr, src_ptr, width);
    return;
  }
  if (y1_fraction == 128) {
    HalfRow_C(src_ptr, src_stride, dst_ptr, width);
    return;
  }
  for (x = 0; x < width - 1; x += 2) {
    dst_ptr[0] =
        (src_ptr[0] * y0_fraction + src_ptr1[0] * y1_fraction + 128) >> 8;
    dst_ptr[1] =
        (src_ptr[1] * y0_fraction + src_ptr1[1] * y1_fraction + 128) >> 8;
    src_ptr += 2;
    src_ptr1 += 2;
    dst_ptr += 2;
  }
  if (width & 1) {
    dst_ptr[0] =
        (src_ptr[0] * y0_fraction + src_ptr1[0] * y1_fraction + 128) >> 8;
  }
}